

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfgconv.cpp
# Opt level: O2

bool isAddrInRange(Addr addr)

{
  bool bVar1;
  _List_node_base *p_Var2;
  
  if (config.ranges.
      super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl._M_node._M_size == 0) {
    return true;
  }
  p_Var2 = (_List_node_base *)&config.ranges;
  do {
    p_Var2 = (((_List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    bVar1 = p_Var2 != (_List_node_base *)0x12a3d0;
    if (p_Var2 == (_List_node_base *)0x12a3d0) {
      return bVar1;
    }
  } while ((addr < *(ulong *)(p_Var2 + 1)) || (*(_List_node_base **)((long)(p_Var2 + 1) + 8) < addr)
          );
  return bVar1;
}

Assistant:

bool isAddrInRange(Addr addr) {
	// if the range list is empty, consider the address in range.
	if (config.ranges.size() == 0)
		return true;

	for (std::list<std::pair<Addr, Addr> >::const_iterator it =  config.ranges.cbegin(),
			ed = config.ranges.cend(); it != ed; it++) {
		if (addr >= it->first && addr <= it->second)
			return true;
	}

	return false;
}